

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diffuselight.hpp
# Opt level: O3

Color __thiscall
DiffuseLight::sampleIrradiance
          (DiffuseLight *this,point *surface,vec3f *dirToLight,float *dist,Sampler *sampler)

{
  undefined4 uVar1;
  undefined4 uVar3;
  undefined8 uVar2;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  Color CVar10;
  SampleInfo info;
  undefined1 local_48 [8];
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  float local_30;
  
  (*this->base->_vptr_Primitive[2])(local_48,this->base,sampler);
  fVar4 = local_40 - surface->z;
  fVar5 = local_48._0_4_;
  fVar7 = fVar5 - surface->x;
  fVar6 = local_48._4_4_;
  fVar8 = fVar6 - surface->y;
  *dist = SQRT(fVar4 * fVar4 + fVar7 * fVar7 + fVar8 * fVar8);
  uVar1 = surface->x;
  uVar3 = surface->y;
  fVar4 = local_40 - surface->z;
  fVar7 = fVar5 - (float)uVar1;
  fVar8 = fVar6 - (float)uVar3;
  fVar9 = 1.0 / SQRT(fVar4 * fVar4 + fVar7 * fVar7 + fVar8 * fVar8);
  dirToLight->x = fVar9 * fVar7;
  dirToLight->y = fVar9 * fVar8;
  dirToLight->z = fVar4 * fVar9;
  fVar5 = fVar5 - surface->x;
  fVar6 = fVar6 - surface->y;
  local_40 = local_40 - surface->z;
  local_30 = ((fVar4 * fVar9 * local_34 + fVar9 * fVar7 * local_3c + fVar9 * fVar8 * local_38) /
             (local_40 * local_40 + fVar5 * fVar5 + fVar6 * fVar6)) / local_30;
  if (this->sampleside == 0) {
    local_30 = ABS(local_30);
  }
  else {
    local_30 = local_30 * (float)this->sampleside;
    if (local_30 <= 0.0) {
      local_30 = 0.0;
    }
  }
  uVar2 = *(undefined8 *)&(this->super_Light).field_0xc;
  CVar10.x = local_30 * (float)uVar2;
  CVar10.y = local_30 * (float)((ulong)uVar2 >> 0x20);
  CVar10.z = local_30 * *(float *)&this->field_0x14;
  return CVar10;
}

Assistant:

Color sampleIrradiance(const point& surface, vec3f& dirToLight, float& dist, Sampler& sampler) const
	{
		assert(samplable);
		auto info = base->sampleSurface(sampler);
		dist = norm(info.p - surface);
		dirToLight = normalized(info.p - surface);
		float t = dot(info.normal, dirToLight) / sqrlen(info.p - surface) / info.pdf;
		t = sampleside? fmax(t*sampleside, 0): fabs(t);
		return t * _radiance;
	}